

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

void __thiscall
rlottie::internal::renderer::SolidLayer::SolidLayer(SolidLayer *this,Layer *layerData)

{
  Drawable *in_RSI;
  Layer *in_RDI;
  Layer *unaff_retaddr;
  
  Layer::Layer(unaff_retaddr,in_RDI);
  (in_RDI->super_Group).super_Object.field_0.mPtr = (char *)&PTR__SolidLayer_001b5bb0;
  Drawable::Drawable(in_RSI);
  VPath::VPath((VPath *)0x160d0c);
  in_RDI[1].mId = 0;
  in_RDI[1].mTimeStreatch = 0.0;
  *(unique_ptr<rlottie::internal::model::Layer::Extra,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
    **)&in_RDI[1].mId = &in_RDI->mExtra;
  return;
}

Assistant:

renderer::SolidLayer::SolidLayer(model::Layer *layerData)
    : renderer::Layer(layerData)
{
    mDrawableList = &mRenderNode;
}